

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Keno.cpp
# Opt level: O3

vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
* __thiscall
Keno::fillKenoVector
          (vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           *__return_storage_ptr__,Keno *this)

{
  void *pvVar1;
  long lVar2;
  double *pdVar3;
  double *pdVar4;
  byte bVar5;
  initializer_list<double> __l;
  initializer_list<double> __l_00;
  initializer_list<double> __l_01;
  initializer_list<double> __l_02;
  initializer_list<double> __l_03;
  initializer_list<double> __l_04;
  initializer_list<double> __l_05;
  initializer_list<double> __l_06;
  initializer_list<double> __l_07;
  initializer_list<std::vector<double,_std::allocator<double>_>_> __l_08;
  undefined8 uStack_3d8;
  allocator_type local_3ca;
  allocator_type local_3c9;
  allocator_type local_3c8 [4];
  allocator_type local_3c4;
  allocator_type local_3c3;
  allocator_type local_3c2;
  allocator_type local_3c1;
  vector<double,_std::allocator<double>_> local_3c0;
  vector<double,_std::allocator<double>_> local_3a8;
  vector<double,_std::allocator<double>_> local_390;
  vector<double,_std::allocator<double>_> local_378;
  vector<double,_std::allocator<double>_> local_360;
  vector<double,_std::allocator<double>_> local_348;
  vector<double,_std::allocator<double>_> local_330;
  vector<double,_std::allocator<double>_> local_318;
  vector<double,_std::allocator<double>_> local_300;
  double local_2e8 [10];
  double local_298 [10];
  double local_248 [10];
  double local_1f8 [10];
  double local_1a8 [10];
  double local_158 [10];
  double local_108 [10];
  double local_b8 [10];
  double local_68 [10];
  
  bVar5 = 0;
  pdVar3 = (double *)&DAT_001506e0;
  pdVar4 = local_68;
  for (lVar2 = 10; lVar2 != 0; lVar2 = lVar2 + -1) {
    *pdVar4 = *pdVar3;
    pdVar3 = pdVar3 + 1;
    pdVar4 = pdVar4 + 1;
  }
  __l._M_len = 10;
  __l._M_array = local_68;
  std::vector<double,_std::allocator<double>_>::vector(&local_3c0,__l,&local_3c1);
  pdVar3 = (double *)&DAT_00150730;
  pdVar4 = local_b8;
  for (lVar2 = 10; lVar2 != 0; lVar2 = lVar2 + -1) {
    *pdVar4 = *pdVar3;
    pdVar3 = pdVar3 + (ulong)bVar5 * -2 + 1;
    pdVar4 = pdVar4 + (ulong)bVar5 * -2 + 1;
  }
  __l_00._M_len = 10;
  __l_00._M_array = local_b8;
  std::vector<double,_std::allocator<double>_>::vector(&local_3a8,__l_00,&local_3c2);
  pdVar3 = (double *)&DAT_00150780;
  pdVar4 = local_108;
  for (lVar2 = 10; lVar2 != 0; lVar2 = lVar2 + -1) {
    *pdVar4 = *pdVar3;
    pdVar3 = pdVar3 + (ulong)bVar5 * -2 + 1;
    pdVar4 = pdVar4 + (ulong)bVar5 * -2 + 1;
  }
  __l_01._M_len = 10;
  __l_01._M_array = local_108;
  std::vector<double,_std::allocator<double>_>::vector(&local_390,__l_01,&local_3c3);
  pdVar3 = (double *)&DAT_001507d0;
  pdVar4 = local_158;
  for (lVar2 = 10; lVar2 != 0; lVar2 = lVar2 + -1) {
    *pdVar4 = *pdVar3;
    pdVar3 = pdVar3 + (ulong)bVar5 * -2 + 1;
    pdVar4 = pdVar4 + (ulong)bVar5 * -2 + 1;
  }
  __l_02._M_len = 10;
  __l_02._M_array = local_158;
  std::vector<double,_std::allocator<double>_>::vector(&local_378,__l_02,&local_3c4);
  pdVar3 = (double *)&DAT_00150820;
  pdVar4 = local_1a8;
  for (lVar2 = 10; lVar2 != 0; lVar2 = lVar2 + -1) {
    *pdVar4 = *pdVar3;
    pdVar3 = pdVar3 + (ulong)bVar5 * -2 + 1;
    pdVar4 = pdVar4 + (ulong)bVar5 * -2 + 1;
  }
  __l_03._M_len = 10;
  __l_03._M_array = local_1a8;
  std::vector<double,_std::allocator<double>_>::vector(&local_360,__l_03,local_3c8 + 3);
  pdVar3 = (double *)&DAT_00150870;
  pdVar4 = local_1f8;
  for (lVar2 = 10; lVar2 != 0; lVar2 = lVar2 + -1) {
    *pdVar4 = *pdVar3;
    pdVar3 = pdVar3 + (ulong)bVar5 * -2 + 1;
    pdVar4 = pdVar4 + (ulong)bVar5 * -2 + 1;
  }
  __l_04._M_len = 10;
  __l_04._M_array = local_1f8;
  std::vector<double,_std::allocator<double>_>::vector(&local_348,__l_04,local_3c8 + 2);
  pdVar3 = (double *)&DAT_001508c0;
  pdVar4 = local_248;
  for (lVar2 = 10; lVar2 != 0; lVar2 = lVar2 + -1) {
    *pdVar4 = *pdVar3;
    pdVar3 = pdVar3 + (ulong)bVar5 * -2 + 1;
    pdVar4 = pdVar4 + (ulong)bVar5 * -2 + 1;
  }
  __l_05._M_len = 10;
  __l_05._M_array = local_248;
  std::vector<double,_std::allocator<double>_>::vector(&local_330,__l_05,local_3c8 + 1);
  pdVar3 = (double *)&DAT_00150910;
  pdVar4 = local_298;
  for (lVar2 = 10; lVar2 != 0; lVar2 = lVar2 + -1) {
    *pdVar4 = *pdVar3;
    pdVar3 = pdVar3 + (ulong)bVar5 * -2 + 1;
    pdVar4 = pdVar4 + (ulong)bVar5 * -2 + 1;
  }
  __l_06._M_len = 10;
  __l_06._M_array = local_298;
  std::vector<double,_std::allocator<double>_>::vector(&local_318,__l_06,local_3c8);
  pdVar3 = (double *)&DAT_00150960;
  pdVar4 = local_2e8;
  for (lVar2 = 10; lVar2 != 0; lVar2 = lVar2 + -1) {
    *pdVar4 = *pdVar3;
    pdVar3 = pdVar3 + (ulong)bVar5 * -2 + 1;
    pdVar4 = pdVar4 + (ulong)bVar5 * -2 + 1;
  }
  __l_07._M_len = 10;
  __l_07._M_array = local_2e8;
  std::vector<double,_std::allocator<double>_>::vector(&local_300,__l_07,&local_3c9);
  __l_08._M_len = 9;
  __l_08._M_array = &local_3c0;
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector(__return_storage_ptr__,__l_08,&local_3ca);
  lVar2 = 0xd8;
  do {
    pvVar1 = *(void **)((long)&uStack_3d8 + lVar2);
    if (pvVar1 != (void *)0x0) {
      operator_delete(pvVar1,*(long *)(local_3c8 + lVar2) - (long)pvVar1);
    }
    lVar2 = lVar2 + -0x18;
  } while (lVar2 != 0);
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::vector<double>> Keno::fillKenoVector() {
	
	const std::vector<std::vector<double>>kenoVector{
				{10,90,0,0,0,0,0,0,0,0},                               //2 Numbers
				{10,20,180,0,0,0,0,0,0,0},							   //3 Numbers
				{0,20,110,200,0,0,0,0,0,0},                            //4 Numbers
				{0,10,40,250,800,0,0,0,0,0},                           //5 Numbers
				{0,10,20,80,450,2000,0,0,0,0},                         //6 Numbers
				{0,0,20,80,170,550,3000,0,0,0},                        //7 Numbers
				{0,0,20,30,120,200,1100,8000,0,0},                     //8 Numbers
				{0,0,10,30,70,170,650,2500,20000,0},                   //9 Numbers
				{0,0,10,20,40,110,300,1000,10000,50000},               //10 Number
	};

	return kenoVector;
}